

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void __thiscall ObjectBlockPool<64,_1024>::~ObjectBlockPool(ObjectBlockPool<64,_1024> *this)

{
  ObjectBlockPool<64,_1024> *this_local;
  
  Reset(this);
  FastVector<SmallBlock<64>_*,_false,_false>::~FastVector(&this->objectsToFree);
  FastVector<SmallBlock<64>_*,_false,_false>::~FastVector(&this->objectsToFinalize);
  FastVector<LargeBlock<64,_1024>_*,_false,_false>::~FastVector(&this->sortedPages);
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}